

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void __thiscall PropagationState::step(PropagationState *this)

{
  int iVar1;
  bool bVar2;
  int4 iVar3;
  reference ppPVar4;
  Varnode *pVVar5;
  PcodeOp *pPVar6;
  PcodeOp *pPVar7;
  _List_const_iterator<PcodeOp_*> local_20;
  _Self local_18;
  PropagationState *local_10;
  PropagationState *this_local;
  
  this->slot = this->slot + 1;
  iVar1 = this->slot;
  local_10 = this;
  iVar3 = PcodeOp::numInput(this->op);
  if (iVar3 <= iVar1) {
    local_18._M_node = (_List_node_base *)Varnode::endDescend(this->vn);
    bVar2 = std::operator!=(&this->iter,&local_18);
    if (bVar2) {
      local_20._M_node =
           (_List_node_base *)std::_List_const_iterator<PcodeOp_*>::operator++(&this->iter,0);
      ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&local_20);
      this->op = *ppPVar4;
      pVVar5 = PcodeOp::getOut(this->op);
      if (pVVar5 == (Varnode *)0x0) {
        this->slot = 0;
      }
      else {
        this->slot = -1;
      }
      iVar3 = PcodeOp::getSlot(this->op,this->vn);
      this->inslot = iVar3;
    }
    else {
      pPVar7 = this->op;
      pPVar6 = Varnode::getDef(this->vn);
      if (pPVar7 == pPVar6) {
        this->op = (PcodeOp *)0x0;
      }
      else {
        pPVar7 = Varnode::getDef(this->vn);
        this->op = pPVar7;
      }
      this->inslot = -1;
      this->slot = 0;
    }
  }
  return;
}

Assistant:

void PropagationState::step(void)

{
  slot += 1;
  if (slot < op->numInput())
    return;
  if (iter != vn->endDescend()) {
    op = *iter++;
    if (op->getOut() != (Varnode *)0)
      slot = -1;
    else
      slot = 0;
    inslot = op->getSlot(vn);
    return;
  }
  if (op == vn->getDef())
    op = (PcodeOp *)0;
  else
    op = vn->getDef();
  inslot = -1;
  slot = 0;
}